

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_dispatch.h
# Opt level: O3

uint __kmp_wait<unsigned_int>(uint *spinner,uint checker,_func_kmp_uint32_uint_uint *pred,void *obj)

{
  kmp_uint32 kVar1;
  uint uVar2;
  uint *puVar3;
  int iVar4;
  int iVar5;
  undefined4 local_3c;
  
  puVar3 = (uint *)__kmp_itt_fsync_prepare_ptr__3_0;
  if (__kmp_itt_fsync_prepare_ptr__3_0 != (undefined1 *)0x0) {
    puVar3 = spinner;
  }
  local_3c = __kmp_yield_init;
  kVar1 = (*pred)(*spinner,checker);
  iVar5 = 0;
  if (kVar1 == 0) {
    iVar5 = 0;
    do {
      if (__kmp_itt_fsync_prepare_ptr__3_0 != (undefined1 *)0x0) {
        if (iVar5 < __kmp_itt_prepare_delay) {
          iVar5 = iVar5 + 1;
          if (__kmp_itt_prepare_delay <= iVar5) {
            (*(code *)__kmp_itt_fsync_prepare_ptr__3_0)(puVar3);
          }
        }
      }
      if (__kmp_use_yield - 1U < 2) {
        iVar4 = __kmp_avail_proc;
        if (__kmp_avail_proc == 0) {
          iVar4 = __kmp_xproc;
        }
        if (iVar4 < __kmp_nth) {
          __kmp_yield();
        }
        else if (__kmp_use_yield == 1) {
          local_3c = local_3c - 2;
          if (local_3c == 0) {
            __kmp_yield();
            local_3c = __kmp_yield_next;
          }
        }
      }
      kVar1 = (*pred)(*spinner,checker);
    } while (kVar1 == 0);
  }
  if (__kmp_itt_fsync_acquired_ptr__3_0 != (undefined1 *)0x0 && __kmp_itt_prepare_delay <= iVar5) {
    uVar2 = (*(code *)__kmp_itt_fsync_acquired_ptr__3_0)(puVar3);
    return uVar2;
  }
  return (uint)__kmp_itt_fsync_acquired_ptr__3_0;
}

Assistant:

static UT __kmp_wait(volatile UT *spinner, UT checker,
                     kmp_uint32 (*pred)(UT, UT) USE_ITT_BUILD_ARG(void *obj)) {
  // note: we may not belong to a team at this point
  volatile UT *spin = spinner;
  UT check = checker;
  kmp_uint32 spins;
  kmp_uint32 (*f)(UT, UT) = pred;
  UT r;

  KMP_FSYNC_SPIN_INIT(obj, CCAST(UT *, spin));
  KMP_INIT_YIELD(spins);
  // main wait spin loop
  while (!f(r = *spin, check)) {
    KMP_FSYNC_SPIN_PREPARE(obj);
    /* GEH - remove this since it was accidentally introduced when kmp_wait was
       split.
       It causes problems with infinite recursion because of exit lock */
    /* if ( TCR_4(__kmp_global.g.g_done) && __kmp_global.g.g_abort)
        __kmp_abort_thread(); */
    // If oversubscribed, or have waited a bit then yield.
    KMP_YIELD_OVERSUB_ELSE_SPIN(spins);
  }
  KMP_FSYNC_SPIN_ACQUIRED(obj);
  return r;
}